

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this)

{
  FieldDescriptor FVar1;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  FVar1 = this[0x34];
  if (FVar1 == (FieldDescriptor)0x1) {
    local_58.text_ = (char *)**(undefined8 **)(*(long *)(this + 0x38) + 8);
    local_58.size_ = *(int *)(*(undefined8 **)(*(long *)(this + 0x38) + 8) + 1);
    local_88.text_ = (char *)0x0;
    local_88.size_ = -1;
    local_b8.text_ = (char *)0x0;
    local_b8.size_ = -1;
    local_e8.text_ = (char *)0x0;
    local_e8.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    local_1d8.text_ = (char *)0x0;
    local_1d8.size_ = -1;
    local_208.text_ = (char *)0x0;
    local_208.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"extend .$0 {\n",&local_58,&local_88,&local_b8,&local_e8,
               &local_118,&local_148,&local_178,&local_1a8,&local_1d8,&local_208);
  }
  DebugString(this,(uint)(FVar1 == (FieldDescriptor)0x1),__return_storage_ptr__);
  if (this[0x34] == (FieldDescriptor)0x1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DebugString() const {
  string contents;
  int depth = 0;
  if (is_extension()) {
    strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                 containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, &contents);
  if (is_extension()) {
     contents.append("}\n");
  }
  return contents;
}